

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_3_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float c2s;
  float *output2;
  float c1s;
  float *output1;
  float c0s;
  float *output0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  float *local_6f0;
  float *local_6e0;
  float *local_6d0;
  float *local_6c0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_78;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  
  local_6d0 = (float *)*in_RDI;
  fVar1 = *in_RSI;
  local_6e0 = (float *)in_RDI[1];
  fVar2 = in_RSI[1];
  local_6f0 = (float *)in_RDI[2];
  fVar3 = in_RSI[2];
  for (local_6c0 = in_RDX; 0x3f < (long)in_RCX - (long)local_6c0; local_6c0 = local_6c0 + 0x10) {
    local_258 = (float)*(undefined8 *)local_6c0;
    fStack_254 = (float)((ulong)*(undefined8 *)local_6c0 >> 0x20);
    fStack_250 = (float)*(undefined8 *)(local_6c0 + 2);
    fStack_24c = (float)((ulong)*(undefined8 *)(local_6c0 + 2) >> 0x20);
    fStack_78 = (float)*(undefined8 *)local_6d0;
    r = (float)((ulong)*(undefined8 *)local_6d0 >> 0x20);
    r0_1[0] = (float)*(undefined8 *)(local_6d0 + 2);
    r0_1[1] = (float)((ulong)*(undefined8 *)(local_6d0 + 2) >> 0x20);
    local_738 = CONCAT44(r + fStack_254 * fVar1,fStack_78 + local_258 * fVar1);
    uStack_730 = CONCAT44(r0_1[1] + fStack_24c * fVar1,r0_1[0] + fStack_250 * fVar1);
    local_278 = (float)*(undefined8 *)(local_6c0 + 4);
    fStack_274 = (float)((ulong)*(undefined8 *)(local_6c0 + 4) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(local_6c0 + 6);
    fStack_26c = (float)((ulong)*(undefined8 *)(local_6c0 + 6) >> 0x20);
    local_98 = (float)*(undefined8 *)(local_6d0 + 4);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_6d0 + 4) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_6d0 + 6);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_6d0 + 6) >> 0x20);
    local_748 = CONCAT44(fStack_94 + fStack_274 * fVar1,local_98 + local_278 * fVar1);
    uStack_740 = CONCAT44(fStack_8c + fStack_26c * fVar1,fStack_90 + fStack_270 * fVar1);
    local_298 = (float)*(undefined8 *)(local_6c0 + 8);
    fStack_294 = (float)((ulong)*(undefined8 *)(local_6c0 + 8) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(local_6c0 + 10);
    fStack_28c = (float)((ulong)*(undefined8 *)(local_6c0 + 10) >> 0x20);
    local_b8 = (float)*(undefined8 *)(local_6d0 + 8);
    fStack_b4 = (float)((ulong)*(undefined8 *)(local_6d0 + 8) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(local_6d0 + 10);
    fStack_ac = (float)((ulong)*(undefined8 *)(local_6d0 + 10) >> 0x20);
    local_758 = CONCAT44(fStack_b4 + fStack_294 * fVar1,local_b8 + local_298 * fVar1);
    uStack_750 = CONCAT44(fStack_ac + fStack_28c * fVar1,fStack_b0 + fStack_290 * fVar1);
    local_2b8 = (float)*(undefined8 *)(local_6c0 + 0xc);
    fStack_2b4 = (float)((ulong)*(undefined8 *)(local_6c0 + 0xc) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(local_6c0 + 0xe);
    fStack_2ac = (float)((ulong)*(undefined8 *)(local_6c0 + 0xe) >> 0x20);
    local_d8 = (float)*(undefined8 *)(local_6d0 + 0xc);
    fStack_d4 = (float)((ulong)*(undefined8 *)(local_6d0 + 0xc) >> 0x20);
    fStack_d0 = (float)*(undefined8 *)(local_6d0 + 0xe);
    fStack_cc = (float)((ulong)*(undefined8 *)(local_6d0 + 0xe) >> 0x20);
    local_768 = CONCAT44(fStack_d4 + fStack_2b4 * fVar1,local_d8 + local_2b8 * fVar1);
    uStack_760 = CONCAT44(fStack_cc + fStack_2ac * fVar1,fStack_d0 + fStack_2b0 * fVar1);
    *(undefined8 *)local_6d0 = local_738;
    *(undefined8 *)(local_6d0 + 2) = uStack_730;
    *(undefined8 *)(local_6d0 + 4) = local_748;
    *(undefined8 *)(local_6d0 + 6) = uStack_740;
    *(undefined8 *)(local_6d0 + 8) = local_758;
    *(undefined8 *)(local_6d0 + 10) = uStack_750;
    *(undefined8 *)(local_6d0 + 0xc) = local_768;
    *(undefined8 *)(local_6d0 + 0xe) = uStack_760;
    local_f8 = (float)*(undefined8 *)local_6e0;
    fStack_f4 = (float)((ulong)*(undefined8 *)local_6e0 >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(local_6e0 + 2);
    fStack_ec = (float)((ulong)*(undefined8 *)(local_6e0 + 2) >> 0x20);
    local_738 = CONCAT44(fStack_f4 + fStack_254 * fVar2,local_f8 + local_258 * fVar2);
    uStack_730 = CONCAT44(fStack_ec + fStack_24c * fVar2,fStack_f0 + fStack_250 * fVar2);
    local_118 = (float)*(undefined8 *)(local_6e0 + 4);
    fStack_114 = (float)((ulong)*(undefined8 *)(local_6e0 + 4) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(local_6e0 + 6);
    fStack_10c = (float)((ulong)*(undefined8 *)(local_6e0 + 6) >> 0x20);
    local_748 = CONCAT44(fStack_114 + fStack_274 * fVar2,local_118 + local_278 * fVar2);
    uStack_740 = CONCAT44(fStack_10c + fStack_26c * fVar2,fStack_110 + fStack_270 * fVar2);
    local_138 = (float)*(undefined8 *)(local_6e0 + 8);
    fStack_134 = (float)((ulong)*(undefined8 *)(local_6e0 + 8) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(local_6e0 + 10);
    fStack_12c = (float)((ulong)*(undefined8 *)(local_6e0 + 10) >> 0x20);
    local_758 = CONCAT44(fStack_134 + fStack_294 * fVar2,local_138 + local_298 * fVar2);
    uStack_750 = CONCAT44(fStack_12c + fStack_28c * fVar2,fStack_130 + fStack_290 * fVar2);
    local_158 = (float)*(undefined8 *)(local_6e0 + 0xc);
    fStack_154 = (float)((ulong)*(undefined8 *)(local_6e0 + 0xc) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(local_6e0 + 0xe);
    fStack_14c = (float)((ulong)*(undefined8 *)(local_6e0 + 0xe) >> 0x20);
    local_768 = CONCAT44(fStack_154 + fStack_2b4 * fVar2,local_158 + local_2b8 * fVar2);
    uStack_760 = CONCAT44(fStack_14c + fStack_2ac * fVar2,fStack_150 + fStack_2b0 * fVar2);
    *(undefined8 *)local_6e0 = local_738;
    *(undefined8 *)(local_6e0 + 2) = uStack_730;
    *(undefined8 *)(local_6e0 + 4) = local_748;
    *(undefined8 *)(local_6e0 + 6) = uStack_740;
    *(undefined8 *)(local_6e0 + 8) = local_758;
    *(undefined8 *)(local_6e0 + 10) = uStack_750;
    *(undefined8 *)(local_6e0 + 0xc) = local_768;
    *(undefined8 *)(local_6e0 + 0xe) = uStack_760;
    local_178 = (float)*(undefined8 *)local_6f0;
    fStack_174 = (float)((ulong)*(undefined8 *)local_6f0 >> 0x20);
    fStack_170 = (float)*(undefined8 *)(local_6f0 + 2);
    fStack_16c = (float)((ulong)*(undefined8 *)(local_6f0 + 2) >> 0x20);
    local_738 = CONCAT44(fStack_174 + fStack_254 * fVar3,local_178 + local_258 * fVar3);
    uStack_730 = CONCAT44(fStack_16c + fStack_24c * fVar3,fStack_170 + fStack_250 * fVar3);
    local_198 = (float)*(undefined8 *)(local_6f0 + 4);
    fStack_194 = (float)((ulong)*(undefined8 *)(local_6f0 + 4) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(local_6f0 + 6);
    fStack_18c = (float)((ulong)*(undefined8 *)(local_6f0 + 6) >> 0x20);
    local_748 = CONCAT44(fStack_194 + fStack_274 * fVar3,local_198 + local_278 * fVar3);
    uStack_740 = CONCAT44(fStack_18c + fStack_26c * fVar3,fStack_190 + fStack_270 * fVar3);
    local_1b8 = (float)*(undefined8 *)(local_6f0 + 8);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(local_6f0 + 8) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(local_6f0 + 10);
    fStack_1ac = (float)((ulong)*(undefined8 *)(local_6f0 + 10) >> 0x20);
    local_758 = CONCAT44(fStack_1b4 + fStack_294 * fVar3,local_1b8 + local_298 * fVar3);
    uStack_750 = CONCAT44(fStack_1ac + fStack_28c * fVar3,fStack_1b0 + fStack_290 * fVar3);
    local_1d8 = (float)*(undefined8 *)(local_6f0 + 0xc);
    fStack_1d4 = (float)((ulong)*(undefined8 *)(local_6f0 + 0xc) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(local_6f0 + 0xe);
    fStack_1cc = (float)((ulong)*(undefined8 *)(local_6f0 + 0xe) >> 0x20);
    local_768 = CONCAT44(fStack_1d4 + fStack_2b4 * fVar3,local_1d8 + local_2b8 * fVar3);
    uStack_760 = CONCAT44(fStack_1cc + fStack_2ac * fVar3,fStack_1d0 + fStack_2b0 * fVar3);
    *(undefined8 *)local_6f0 = local_738;
    *(undefined8 *)(local_6f0 + 2) = uStack_730;
    *(undefined8 *)(local_6f0 + 4) = local_748;
    *(undefined8 *)(local_6f0 + 6) = uStack_740;
    *(undefined8 *)(local_6f0 + 8) = local_758;
    *(undefined8 *)(local_6f0 + 10) = uStack_750;
    *(undefined8 *)(local_6f0 + 0xc) = local_768;
    *(undefined8 *)(local_6f0 + 0xe) = uStack_760;
    local_6d0 = local_6d0 + 0x10;
    local_6e0 = local_6e0 + 0x10;
    local_6f0 = local_6f0 + 0x10;
  }
  for (; 0xf < (long)in_RCX - (long)local_6c0; local_6c0 = local_6c0 + 4) {
    local_3d8 = (float)*(undefined8 *)local_6c0;
    fStack_3d4 = (float)((ulong)*(undefined8 *)local_6c0 >> 0x20);
    fStack_3d0 = (float)*(undefined8 *)(local_6c0 + 2);
    fStack_3cc = (float)((ulong)*(undefined8 *)(local_6c0 + 2) >> 0x20);
    local_1f8 = (float)*(undefined8 *)local_6d0;
    fStack_1f4 = (float)((ulong)*(undefined8 *)local_6d0 >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(local_6d0 + 2);
    fStack_1ec = (float)((ulong)*(undefined8 *)(local_6d0 + 2) >> 0x20);
    local_7b8 = CONCAT44(fStack_1f4 + fStack_3d4 * fVar1,local_1f8 + local_3d8 * fVar1);
    uStack_7b0 = CONCAT44(fStack_1ec + fStack_3cc * fVar1,fStack_1f0 + fStack_3d0 * fVar1);
    *(undefined8 *)local_6d0 = local_7b8;
    *(undefined8 *)(local_6d0 + 2) = uStack_7b0;
    local_218 = (float)*(undefined8 *)local_6e0;
    fStack_214 = (float)((ulong)*(undefined8 *)local_6e0 >> 0x20);
    fStack_210 = (float)*(undefined8 *)(local_6e0 + 2);
    fStack_20c = (float)((ulong)*(undefined8 *)(local_6e0 + 2) >> 0x20);
    local_7b8 = CONCAT44(fStack_214 + fStack_3d4 * fVar2,local_218 + local_3d8 * fVar2);
    uStack_7b0 = CONCAT44(fStack_20c + fStack_3cc * fVar2,fStack_210 + fStack_3d0 * fVar2);
    *(undefined8 *)local_6e0 = local_7b8;
    *(undefined8 *)(local_6e0 + 2) = uStack_7b0;
    local_238 = (float)*(undefined8 *)local_6f0;
    fStack_234 = (float)((ulong)*(undefined8 *)local_6f0 >> 0x20);
    fStack_230 = (float)*(undefined8 *)(local_6f0 + 2);
    fStack_22c = (float)((ulong)*(undefined8 *)(local_6f0 + 2) >> 0x20);
    local_7b8 = CONCAT44(fStack_234 + fStack_3d4 * fVar3,local_238 + local_3d8 * fVar3);
    uStack_7b0 = CONCAT44(fStack_22c + fStack_3cc * fVar3,fStack_230 + fStack_3d0 * fVar3);
    *(undefined8 *)local_6f0 = local_7b8;
    *(undefined8 *)(local_6f0 + 2) = uStack_7b0;
    local_6d0 = local_6d0 + 4;
    local_6e0 = local_6e0 + 4;
    local_6f0 = local_6f0 + 4;
  }
  for (; local_6c0 < in_RCX; local_6c0 = local_6c0 + 1) {
    fVar4 = *local_6c0;
    *local_6d0 = fVar4 * fVar1 + *local_6d0;
    *local_6e0 = fVar4 * fVar2 + *local_6e0;
    *local_6f0 = fVar4 * fVar3 + *local_6f0;
    local_6d0 = local_6d0 + 1;
    local_6e0 = local_6e0 + 1;
    local_6f0 = local_6f0 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}